

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Node * __thiscall
google::protobuf::Map<int,_proto2_unittest::Proto2MapEnum>::CloneFromOther
          (Map<int,_proto2_unittest::Proto2MapEnum> *this,
          Map<int,_proto2_unittest::Proto2MapEnum> *other)

{
  bool bVar1;
  reference __in;
  type *args;
  type *args_00;
  Map<int,_proto2_unittest::Proto2MapEnum> *pMVar2;
  Node *new_node;
  type *value;
  type *key;
  undefined1 local_78 [8];
  const_iterator __end0;
  const_iterator __begin0;
  Map<int,_proto2_unittest::Proto2MapEnum> *__range3;
  Node *head;
  Map<int,_proto2_unittest::Proto2MapEnum> *other_local;
  Map<int,_proto2_unittest::Proto2MapEnum> *this_local;
  Node *node;
  
  __range3 = (Map<int,_proto2_unittest::Proto2MapEnum> *)0x0;
  begin((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,other);
  end((const_iterator *)local_78,other);
  while( true ) {
    bVar1 = protobuf::operator!=
                      ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)local_78);
    if (!bVar1) break;
    __in = const_iterator::operator*
                     ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    args = std::get<0ul,int_const,proto2_unittest::Proto2MapEnum>(__in);
    args_00 = std::get<1ul,int_const,proto2_unittest::Proto2MapEnum>(__in);
    pMVar2 = (Map<int,_proto2_unittest::Proto2MapEnum> *)
             internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x10);
    bVar1 = internal::InitializeMapKey<int,int_const&>
                      ((int *)&(pMVar2->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.
                               index_of_first_non_null_,args,
                       (this->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.arena_);
    if (!bVar1) {
      Arena::CreateInArenaStorage<int,int_const&>
                ((int *)&(pMVar2->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.
                         index_of_first_non_null_,
                 (this->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.arena_,args);
    }
    Arena::
    CreateInArenaStorage<proto2_unittest::Proto2MapEnum,proto2_unittest::Proto2MapEnum_const&>
              ((Proto2MapEnum *)
               &(pMVar2->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.type_info_,
               (this->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.arena_,args_00);
    *(Map<int,_proto2_unittest::Proto2MapEnum> **)
     &(pMVar2->super_KeyMapBase<unsigned_int>).super_UntypedMapBase = __range3;
    const_iterator::operator++((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    __range3 = pMVar2;
  }
  return (Node *)__range3;
}

Assistant:

PROTOBUF_NOINLINE Node* CloneFromOther(const Map& other) {
    Node* head = nullptr;
    for (const auto& [key, value] : other) {
      Node* new_node;
      if constexpr (std::is_base_of_v<MessageLite, mapped_type>) {
        new_node = CreateNode(key);
        new_node->kv.second = value;
      } else {
        new_node = CreateNode(key, value);
      }
      new_node->next = head;
      head = new_node;
    }
    return head;
  }